

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

void __thiscall Matrix::Matrix(Matrix *this,Matrix *m)

{
  Matrix *m_local;
  Matrix *this_local;
  
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_0018f6e8;
  boost::shared_array<double>::shared_array(&this->matrixParent);
  std::__cxx11::string::string((string *)&this->sMatrixName,(string *)&m->sMatrixName);
  copy(this,(EVP_PKEY_CTX *)m,(EVP_PKEY_CTX *)0x1);
  return;
}

Assistant:

Matrix::Matrix( const Matrix &m ) : sMatrixName( m.sMatrixName )
{
	// do a shallow copy so we don't shift memory each time a fcn returns a matrix
    copy( m, true );
}